

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O2

void memory_tree_ns::split_leaf(memory_tree *b,single_learner *base,uint32_t cn)

{
  v_array<memory_tree_ns::node> *this;
  polyprediction *ppVar1;
  size_t sVar2;
  uint *puVar3;
  example *peVar4;
  bool bVar5;
  bool bVar6;
  single_learner *this_00;
  ulong uVar7;
  ulong uVar8;
  ostream *poVar9;
  node *pnVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  uint32_t cn_00;
  size_t ec_id;
  float fVar14;
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  float local_e8;
  uint32_t ec_pos;
  long local_e0;
  ulong local_d8;
  ulong local_d0;
  long local_c8;
  label_t local_c0;
  ulong local_b8;
  ulong local_b0;
  v_array<memory_tree_ns::node> *local_a8;
  single_learner *local_a0;
  labels preds;
  labels multilabels;
  
  (b->nodes)._begin[cn].internal = 1;
  this = &b->nodes;
  uVar7 = ((long)(b->nodes)._end - (long)(b->nodes)._begin) / 0x48;
  multilabels.label_v._begin = (uint *)0x0;
  multilabels.label_v._end = (uint *)0x0;
  multilabels.label_v.end_array = (uint *)0x0;
  multilabels.label_v.erase_count = 0x3f50624dd2f1a9fc;
  local_a0 = base;
  v_array<memory_tree_ns::node>::push_back(this,(node *)&multilabels);
  uVar11 = uVar7 & 0xffffffff;
  (b->nodes)._begin[uVar11].internal = -1;
  pnVar10 = (b->nodes)._begin;
  sVar2 = b->routers_used;
  b->routers_used = sVar2 + 1;
  pnVar10[uVar11].base_router = (uint32_t)sVar2;
  uVar8 = ((long)(b->nodes)._end - (long)(b->nodes)._begin) / 0x48;
  multilabels.label_v._begin = (uint *)0x0;
  multilabels.label_v._end = (uint *)0x0;
  multilabels.label_v.end_array = (uint *)0x0;
  multilabels.label_v.erase_count = 0x3f50624dd2f1a9fc;
  local_d0 = uVar7;
  local_b0 = uVar11;
  local_a8 = this;
  v_array<memory_tree_ns::node>::push_back(this,(node *)&multilabels);
  local_b8 = uVar8 & 0xffffffff;
  local_e0 = local_b8 * 0x48;
  (b->nodes)._begin[local_b8].internal = -1;
  pnVar10 = (b->nodes)._begin;
  sVar2 = b->routers_used;
  b->routers_used = sVar2 + 1;
  pnVar10[local_b8].base_router = (uint32_t)sVar2;
  pnVar10 = (b->nodes)._begin;
  uVar7 = (ulong)(pnVar10[cn].depth + 1);
  local_d8 = uVar8;
  if (b->max_depth < uVar7) {
    b->max_depth = uVar7;
    poVar9 = std::operator<<((ostream *)&std::cout,"depth ");
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::endl<char,std::char_traits<char>>(poVar9);
    pnVar10 = (b->nodes)._begin;
  }
  this_00 = local_a0;
  pnVar10[cn].left = (uint32_t)local_d0;
  (b->nodes)._begin[cn].right = (uint32_t)local_d8;
  (b->nodes)._begin[uVar11].parent = cn;
  *(uint32_t *)((long)&((b->nodes)._begin)->parent + local_e0) = cn;
  pnVar10 = (b->nodes)._begin;
  pnVar10[uVar11].depth = pnVar10[cn].depth + 1;
  pnVar10 = (b->nodes)._begin;
  *(uint32_t *)((long)&pnVar10->depth + local_e0) = pnVar10[cn].depth + 1;
  pnVar10 = (b->nodes)._begin;
  if (b->max_depth < (ulong)pnVar10[uVar11].depth) {
    b->max_depth = (ulong)pnVar10[uVar11].depth;
  }
  local_c8 = uVar11 * 0x48;
  for (uVar7 = 0; puVar3 = pnVar10[cn].examples_index._begin,
      uVar7 < (ulong)((long)pnVar10[cn].examples_index._end - (long)puVar3 >> 2); uVar7 = uVar7 + 1)
  {
    ec_pos = puVar3[uVar7];
    peVar4 = (b->examples)._begin[ec_pos];
    if (b->oas == 0) {
      local_c0 = (peVar4->l).multi;
      local_e8 = (peVar4->pred).scalar;
    }
    else {
      multilabels.label_v._begin = (peVar4->l).multilabels.label_v._begin;
      multilabels.label_v._end = (peVar4->l).multilabels.label_v._end;
      multilabels.label_v.end_array = (peVar4->l).multilabels.label_v.end_array;
      multilabels.label_v.erase_count = (peVar4->l).cs.costs.erase_count;
      preds.label_v._begin = (peVar4->pred).multilabels.label_v._begin;
      preds.label_v._end = (peVar4->pred).multilabels.label_v._end;
      preds.label_v.end_array = (peVar4->pred).multilabels.label_v.end_array;
      preds.label_v.erase_count = (peVar4->pred).scalars.erase_count;
      local_e8 = 0.0;
    }
    (peVar4->l).cs.costs._begin = (wclass *)0x3f8000003f800000;
    (peVar4->l).simple.initial = 0.0;
    LEARNER::learner<char,_example>::predict
              (this_00,(b->examples)._begin[ec_pos],(ulong)(b->nodes)._begin[cn].base_router);
    ppVar1 = &(b->examples)._begin[ec_pos]->pred;
    bVar5 = ppVar1->scalar != 0.0;
    bVar6 = ppVar1->scalar <= 0.0;
    uVar8 = local_b8;
    if (bVar6 && bVar5) {
      uVar8 = local_b0;
    }
    cn_00 = (uint32_t)local_d8;
    if (bVar6 && bVar5) {
      cn_00 = (uint32_t)local_d0;
    }
    v_array<unsigned_int>::push_back(&(b->nodes)._begin[uVar8].examples_index,&ec_pos);
    fVar14 = train_node(b,this_00,(b->examples)._begin[ec_pos],cn_00);
    pnVar10 = (b->nodes)._begin;
    (&pnVar10[uVar8].nl)[0.0 <= fVar14] = (&pnVar10[uVar8].nl)[0.0 <= fVar14] + 1.0;
    uVar8 = (ulong)ec_pos;
    peVar4 = (b->examples)._begin[uVar8];
    if (b->oas == 0) {
      (peVar4->l).multi = local_c0;
      ((b->examples)._begin[uVar8]->pred).scalar = local_e8;
    }
    else {
      (peVar4->pred).multilabels.label_v.end_array = preds.label_v.end_array;
      (peVar4->pred).scalars.erase_count = preds.label_v.erase_count;
      (peVar4->pred).multilabels.label_v._begin = preds.label_v._begin;
      (peVar4->pred).multilabels.label_v._end = preds.label_v._end;
      peVar4 = (b->examples)._begin[uVar8];
      (peVar4->l).multilabels.label_v.end_array = multilabels.label_v.end_array;
      (peVar4->l).cs.costs.erase_count = multilabels.label_v.erase_count;
      (peVar4->l).multilabels.label_v._begin = multilabels.label_v._begin;
      (peVar4->l).multilabels.label_v._end = multilabels.label_v._end;
    }
    pnVar10 = local_a8->_begin;
  }
  v_array<unsigned_int>::delete_v(&pnVar10[cn].examples_index);
  pnVar10 = (b->nodes)._begin;
  lVar12 = *(long *)((long)&(pnVar10->examples_index)._end + local_c8) -
           *(long *)((long)&(pnVar10->examples_index)._begin + local_c8);
  lVar13 = lVar12 >> 2;
  auVar15._8_4_ = (int)(lVar12 >> 0x22);
  auVar15._0_8_ = lVar13;
  auVar15._12_4_ = 0x45300000;
  dVar16 = (auVar15._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0);
  dVar19 = 0.001;
  if (0.001 <= dVar16) {
    dVar19 = dVar16;
  }
  pnVar10[cn].nl = dVar19;
  pnVar10 = (b->nodes)._begin;
  lVar12 = *(long *)((long)&(pnVar10->examples_index)._end + local_e0) -
           *(long *)((long)&(pnVar10->examples_index)._begin + local_e0);
  lVar13 = lVar12 >> 2;
  auVar17._8_4_ = (int)(lVar12 >> 0x22);
  auVar17._0_8_ = lVar13;
  auVar17._12_4_ = 0x45300000;
  dVar16 = (auVar17._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0);
  dVar19 = 0.001;
  if (0.001 <= dVar16) {
    dVar19 = dVar16;
  }
  pnVar10[cn].nr = dVar19;
  pnVar10 = (b->nodes)._begin;
  dVar16 = pnVar10[cn].nr;
  dVar19 = pnVar10[cn].nl;
  if (dVar16 <= dVar19) {
    dVar16 = dVar19;
  }
  sVar2 = b->max_ex_in_leaf;
  auVar18._8_4_ = (int)(sVar2 >> 0x20);
  auVar18._0_8_ = sVar2;
  auVar18._12_4_ = 0x45300000;
  if ((auVar18._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0) < dVar16) {
    b->max_ex_in_leaf = (long)(dVar16 - 9.223372036854776e+18) & (long)dVar16 >> 0x3f | (long)dVar16
    ;
  }
  return;
}

Assistant:

void split_leaf(memory_tree& b, single_learner& base, const uint32_t cn)
    {
        //create two children
        b.nodes[cn].internal = 1; //swith to internal node.
        uint32_t left_child = (uint32_t)b.nodes.size();
        b.nodes.push_back(node());
        b.nodes[left_child].internal = -1;  //left leaf
        b.nodes[left_child].base_router = (b.routers_used++);
        uint32_t right_child = (uint32_t)b.nodes.size();
        b.nodes.push_back(node());  
        b.nodes[right_child].internal = -1;  //right leaf
        b.nodes[right_child].base_router = (b.routers_used++); 

        if (b.nodes[cn].depth + 1 > b.max_depth){
            b.max_depth = b.nodes[cn].depth + 1;
            cout<<"depth "<<b.max_depth<<endl;
        }

        b.nodes[cn].left = left_child;
        b.nodes[cn].right = right_child;
        b.nodes[left_child].parent = cn;
        b.nodes[right_child].parent = cn;
        b.nodes[left_child].depth = b.nodes[cn].depth + 1;
        b.nodes[right_child].depth = b.nodes[cn].depth + 1;

        if (b.nodes[left_child].depth > b.max_depth)
            b.max_depth = b.nodes[left_child].depth;

        //rout the examples stored in the node to the left and right
        for(size_t ec_id = 0; ec_id < b.nodes[cn].examples_index.size(); ec_id++) //scan all examples stored in the cn
        {
            uint32_t ec_pos = b.nodes[cn].examples_index[ec_id];
            MULTICLASS::label_t mc;
            uint32_t save_multi_pred = 0;
            MULTILABEL::labels multilabels;
            MULTILABEL::labels preds;
            if (b.oas == false){
                mc = b.examples[ec_pos]->l.multi;
                save_multi_pred = b.examples[ec_pos]->pred.multiclass;
            }
            else{
                multilabels = b.examples[ec_pos]->l.multilabels;
                preds = b.examples[ec_pos]->pred.multilabels;
            }

            b.examples[ec_pos]->l.simple = {1.f, 1.f, 0.f};
            base.predict(*b.examples[ec_pos], b.nodes[cn].base_router); //re-predict
            float scalar = b.examples[ec_pos]->pred.scalar; //this is spliting the leaf. 
            if (scalar < 0)
            {
                b.nodes[left_child].examples_index.push_back(ec_pos);
                float leaf_pred = train_node(b, base, *b.examples[ec_pos], left_child);
                insert_descent(b.nodes[left_child], leaf_pred); //fake descent, only for update nl and nr                
            }
            else
            {
                b.nodes[right_child].examples_index.push_back(ec_pos);
                float leaf_pred = train_node(b, base, *b.examples[ec_pos], right_child);
                insert_descent(b.nodes[right_child], leaf_pred); //fake descent. for update nr and nl
            }

            if(b.oas == false){
                b.examples[ec_pos]->l.multi = mc;
                b.examples[ec_pos]->pred.multiclass = save_multi_pred;
            }
            else{
                b.examples[ec_pos]->pred.multilabels = preds;
                b.examples[ec_pos]->l.multilabels = multilabels;
            }
        }
        b.nodes[cn].examples_index.delete_v(); //empty the cn's example list
        b.nodes[cn].nl = (std::max)(double(b.nodes[left_child].examples_index.size()), 0.001); //avoid to set nl to zero
        b.nodes[cn].nr = (std::max)(double(b.nodes[right_child].examples_index.size()), 0.001); //avoid to set nr to zero

        if ((std::max)(b.nodes[cn].nl, b.nodes[cn].nr) > b.max_ex_in_leaf)
        {
            b.max_ex_in_leaf = (std::max)(b.nodes[cn].nl, b.nodes[cn].nr);
            //cout<<b.max_ex_in_leaf<<endl;
        }
    }